

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HAPI.cpp
# Opt level: O3

void solve_fromArrays_dense
               (int *probStatus,int *basisStatus,int XnumCol,int XnumRow,int XobjSense,
               int XobjOffset,double *XcolCost,double *XcolLower,double *XcolUpper,double *XrowLower
               ,double *XrowUpper,double *XAmatrix,double *colPrimalValues,double *colDualValues,
               double *rowPrimalValues,double *rowDualValues,int *basicVariables)

{
  double dVar1;
  double *pdVar2;
  int *XAindex;
  int *XAstart;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int XnumNz;
  int in_stack_ffffffffffffff38;
  
  uVar4 = (ulong)(uint)XnumRow;
  if (XnumCol < 1) {
    XnumNz = 0;
  }
  else {
    uVar6 = 0;
    XnumNz = 0;
    pdVar2 = XAmatrix;
    do {
      if (0 < XnumRow) {
        uVar5 = 0;
        do {
          XnumNz = XnumNz + (uint)(pdVar2[uVar5] != 0.0);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      uVar6 = uVar6 + 1;
      pdVar2 = pdVar2 + uVar4;
    } while (uVar6 != (uint)XnumCol);
  }
  pdVar2 = (double *)malloc((long)XnumNz * 8);
  XAindex = (int *)malloc((long)XnumNz << 2);
  XAstart = (int *)malloc((long)XnumCol * 4 + 4);
  *XAstart = 0;
  if (0 < XnumCol) {
    iVar3 = 0;
    uVar6 = 0;
    do {
      if (0 < XnumRow) {
        uVar5 = 0;
        do {
          dVar1 = XAmatrix[uVar5];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            XAindex[iVar3] = (int)uVar5;
            pdVar2[iVar3] = dVar1;
            iVar3 = iVar3 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      XAstart[uVar6 + 1] = iVar3;
      uVar6 = uVar6 + 1;
      XAmatrix = XAmatrix + uVar4;
    } while (uVar6 != (uint)XnumCol);
  }
  solve_fromArrays(probStatus,basisStatus,XnumCol,XnumRow,XnumNz,XobjSense,in_stack_ffffffffffffff38
                   ,XcolCost,XcolLower,XcolUpper,XrowLower,XrowUpper,XAstart,XAindex,pdVar2,
                   colPrimalValues,colDualValues,rowPrimalValues,rowDualValues,basicVariables);
  return;
}

Assistant:

void solve_fromArrays_dense(int* probStatus, int* basisStatus,
		      const int XnumCol, const int XnumRow, 
		      const int XobjSense, const int XobjOffset,
		      const double* XcolCost, const double* XcolLower, const double* XcolUpper,
		      const double* XrowLower, const double* XrowUpper,
		      const double* XAmatrix,
		      double* colPrimalValues, double* colDualValues,
		      double* rowPrimalValues, double* rowDualValues,
		      int* basicVariables) {
  double* XAvalue;
  int* XAstart;
  int* XAindex;
  int XnumNz=0;
  for (int c_n = 0; c_n<XnumCol; c_n++) {
    for (int r_n = 0; r_n<XnumRow; r_n++) {
      double r_v = XAmatrix[r_n+c_n*XnumRow];
      if (r_v != 0) XnumNz++;
    }
  }
  XAvalue = (double *) malloc(sizeof(double)*XnumNz);
  XAindex = (int *) malloc(sizeof(int)*XnumNz);
  XAstart = (int *) malloc(sizeof(int)*(XnumCol+1));
  XAstart[0] = 0;
  for (int c_n = 0; c_n<XnumCol; c_n++) {
    int el_n = XAstart[c_n];
    for (int r_n = 0; r_n<XnumRow; r_n++) {
      double r_v = XAmatrix[r_n+c_n*XnumRow];
      if (r_v != 0) {
  	XAindex[el_n] = r_n;
  	XAvalue[el_n] = r_v;
  	el_n++;
      }
    }
    XAstart[c_n+1] = el_n;
  }
  solve_fromArrays(probStatus, basisStatus,
		   XnumCol, XnumRow, XnumNz, 
		   XobjSense, XobjOffset,
		   XcolCost, XcolLower, XcolUpper,
		   XrowLower, XrowUpper,
		   XAstart, XAindex, XAvalue,
		   colPrimalValues, colDualValues,
		   rowPrimalValues, rowDualValues,
		   basicVariables);
}